

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O1

int __thiscall
CVmObjBigNum::getp_atan(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  short sVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  err_frame_t *peVar6;
  CVmException *pCVar7;
  byte bVar8;
  int iVar9;
  unsigned_long val;
  size_t prec;
  long *in_FS_OFFSET;
  char *ext1;
  char *ext2;
  char *ext4;
  char *ext5;
  uint hdl5;
  uint hdl4;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  char *ext3;
  char *new_ext;
  char *local_118;
  err_frame_t err_cur__;
  
  uVar1 = *(ushort *)(this->super_CVmObject).ext_;
  iVar9 = setup_getp_0(this,self,retval,argc,&new_ext);
  if (iVar9 == 0) {
    prec = (ulong)uVar1 + 3;
    local_118 = cache_pi(prec);
    alloc_temp_regs(prec,5,&ext1,&hdl1,&ext2,&hdl2,&ext3,&hdl3,&ext4,&hdl4,&ext5,&hdl5);
    G_err_frame::__tls_init();
    err_cur__.prv_ = (err_frame_t *)*in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)&err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    if (err_cur__.state_ == 0) {
      pcVar3 = (this->super_CVmObject).ext_;
      sVar2 = *(short *)(pcVar3 + 2);
      if ((ushort)(sVar2 - 3U) < 0xfffc) {
        if (sVar2 < 0) {
          ext1[2] = '\x01';
          ext1[3] = '\0';
          ext1[4] = ext1[4] & 0xf0U | 8;
          memset(ext1 + 5,0,(ulong)(*(ushort *)ext1 + 1 >> 1));
          copy_val(ext2,(this->super_CVmObject).ext_,0);
        }
        else {
          copy_val(ext1,local_118,1);
          div_by_long(ext1,2,(unsigned_long *)0x0);
          ext1[4] = ext1[4] & 0xfeU | (this->super_CVmObject).ext_[4] & 1U;
          compute_quotient_into(ext2,(char *)0x0,(char *)"\x01",(this->super_CVmObject).ext_);
        }
        bVar4 = sVar2 >= 0;
        compute_prod_into(ext3,ext2,ext2);
        val = 1;
        do {
          copy_val(ext4,ext2,0);
          div_by_long(ext4,val,(unsigned_long *)0x0);
          if (bVar4) {
            ext4[4] = ext4[4] ^ 1;
          }
          if ((val == 1) ||
             (((ext4[4] & 8U) == 0 &&
              ((int)*(short *)(ext1 + 2) - (int)*(short *)(ext4 + 2) <= (int)(uint)*(ushort *)ext1))
             )) {
            bVar4 = !bVar4;
            compute_sum_into(ext5,ext1,ext4);
            pcVar3 = ext1;
            ext1 = ext5;
            ext5 = pcVar3;
            val = val + 2;
            compute_prod_into(ext4,ext2,ext3);
            pcVar3 = ext2;
            ext2 = ext4;
            ext4 = pcVar3;
            bVar5 = true;
          }
          else {
            bVar5 = false;
          }
        } while (bVar5);
        copy_val(new_ext,ext1,1);
      }
      else {
        compute_prod_into(ext1,pcVar3,pcVar3);
        increment_abs(ext1);
        compute_sqrt_into(ext2,ext1);
        compute_quotient_into(ext1,(char *)0x0,(char *)"\x01",ext2);
        calc_asincos_into(new_ext,ext1,1);
        if ((((this->super_CVmObject).ext_[4] & 1U) != 0) && (bVar8 = new_ext[4], (bVar8 & 8) == 0))
        {
          if ((bVar8 & 1) == 0) {
            bVar8 = bVar8 | 1;
          }
          else {
            bVar8 = bVar8 & 0xf6;
          }
          new_ext[4] = bVar8;
        }
      }
    }
    if (-1 < (short)err_cur__.state_) {
      err_cur__.state_ = err_cur__.state_ | 0x8000;
      release_temp_regs(5,(ulong)hdl1,(ulong)hdl2,(ulong)hdl3,(ulong)hdl4,(ulong)hdl5);
    }
    peVar6 = err_cur__.prv_;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)peVar6;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pCVar7 = err_cur__.exc_;
      G_err_frame::__tls_init();
      *(CVmException **)(*in_FS_OFFSET + 0x10) = pCVar7;
      err_rethrow();
    }
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_atan(VMG_ vm_obj_id_t self,
                            vm_val_t *retval, uint *argc)
{
    char *new_ext;
    size_t prec = get_prec(ext_);
    uint hdl1, hdl2, hdl3, hdl4, hdl5;
    char *ext1, *ext2, *ext3, *ext4, *ext5;
    const char *pi;

    /* check arguments and set up the result */
    if (setup_getp_0(vmg_ self, retval, argc, &new_ext))
        return TRUE;

    /* cache pi to our working precision */
    pi = cache_pi(prec + 3);

    /* allocate some temporary registers */
    alloc_temp_regs(prec + 3, 5,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3,
                    &ext4, &hdl4, &ext5, &hdl5);

    /* catch errors so we can be sure to free registers */
    err_try
    {
        /*
         *   If x has absolute value close to 1, either above or below,
         *   our two series don't converge very rapidly.  Happily, we can
         *   fall back on an alternative in these case by using the
         *   relation
         *   
         *   arctan(x) = (+/-)arccos(1/sqrt(x^2+1))
         *   
         *   (The sign of the result is the same as the sign of x.)  Since
         *   we already have routines for arccosine and square root, this
         *   calculation is easy.
         *   
         *   If x doesn't have absolute value close to 1, use the
         *   appropriate series, since they converge rapidly.  
         */
        if (get_exp(ext_) < -1 || get_exp(ext_) > 2)
        {
            int term_neg;
            ulong n;
            
            /* 
             *   exponent less than -1 -> the number has a small absolute
             *   value - use the small-x series expansion:
             *   
             *   x - x^3/3 + x^5/5 - x^7/7 ...
             *   
             *   OR
             *   
             *   exponent greater than 2 -> the number has a large
             *   absolute value, so the large-x series expansion should
             *   converge quickly:
             *   
             *   +/- pi/2 - 1/x + 1/3x^3 - 1/5x^5 ...
             *   
             *   (the sign of the leading pi/2 term is positive if x is
             *   positive, negative if x is negative)
             *   
             *   We can commonize these expressions by defining x' = x for
             *   small x and x' = 1/x for large x, defining C as 0 for
             *   small x and +/-pi/2 for large X, defining N as +1 for
             *   small x and -1 for large x, and rewriting the series as:
             *   
             *   C + Nx' - Nx'^3/3 + Nx'^5/5 + ...  
             */

            /* check for large or small value */
            if (get_exp(ext_) < 0)
            {
                /* small number - start with zero in the accumulator (r1) */
                set_zero(ext1);

                /* get the current power of x' into r2 - this is simply x */
                copy_val(ext2, ext_, FALSE);

                /* the first term (x) is positive */
                term_neg = FALSE;
            }
            else
            {
                /* large number - start with pi/2 in the accumulator (r1) */
                copy_val(ext1, pi, TRUE);
                div_by_long(ext1, 2);

                /* if x is negative, make that -pi/2 */
                set_neg(ext1, get_neg(ext_));

                /* get 1/x into r2 - this is our x' term value */
                compute_quotient_into(ext2, 0, get_one(), ext_);

                /* the first term (1/x) is negative */
                term_neg = TRUE;
            }

            /* start at the first term */
            n = 1;

            /* 
             *   get x'^2 into r3 - we'll use this to calculate each
             *   subsequent term (we need x', x'^3, x'^5, etc) 
             */
            compute_prod_into(ext3, ext2, ext2);

            /* iterate until we reach the desired precision */
            for (;;)
            {
                char *tmp;
                
                /* copy the current power term from r2 into r4 */
                copy_val(ext4, ext2, FALSE);

                /* 
                 *   divide by the current term constant (we'll never have
                 *   to compute billions of terms to reach our maximum
                 *   possible 64k digits of precision, so 'n' will always be
                 *   way less than the div_by_long limit of ULONG_MAX/10) 
                 */
                div_by_long(ext4, n);

                /* negate this term if necessary */
                if (term_neg)
                    set_neg(ext4, !get_neg(ext4));

                /* 
                 *   if we're under the radar on precision, stop looping
                 *   (don't stop on the first term, since the accumulator
                 *   hasn't been fully primed yet) 
                 */
                if (n != 1
                    && (is_zero(ext4)
                        || (get_exp(ext1) - get_exp(ext4)
                            > (int)get_prec(ext1))))
                    break;

                /* compute the sum of the accumulator and this term */
                compute_sum_into(ext5, ext1, ext4);

                /* swap the result back into the accumulator */
                tmp = ext1;
                ext1 = ext5;
                ext5 = tmp;

                /* 
                 *   move on to the next term - advance n by 2 and swap
                 *   the term sign 
                 */
                n += 2;
                term_neg = !term_neg;

                /* 
                 *   compute the next power term - multiply r2 (the latest
                 *   x' power) by r3 (x'^2) 
                 */
                compute_prod_into(ext4, ext2, ext3);

                /* swap r4 back into r2 - this is now the latest power */
                tmp = ext2;
                ext2 = ext4;
                ext4 = tmp;
            }

            /* store the result, rounding as needed */
            copy_val(new_ext, ext1, TRUE);
        }